

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

_Bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar9;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar8;
  stbtt_uint8 sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ushort uVar15;
  int iVar16;
  undefined4 uVar17;
  undefined1 uVar21;
  ImFontAtlas_conflict *pIVar18;
  ImFont *pIVar19;
  stbtt_uint8 *data;
  undefined6 uVar22;
  undefined4 uVar23;
  stbtt__active_edge *psVar20;
  stbrp_node_conflict *psVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined4 uVar36;
  undefined4 uVar37;
  undefined1 auVar38 [15];
  unkuint9 Var39;
  undefined1 auVar40 [15];
  undefined1 auVar41 [13];
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  undefined1 auVar44 [15];
  unkbyte10 Var45;
  uint6 uVar46;
  stbrp_rect_conflict *psVar47;
  stbtt_uint32 sVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  _Bool _Var48;
  stbtt__active_edge *z;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  stbtt_uint32 sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  ImFontBuildSrcData *pIVar60;
  ImFontConfig_conflict *pIVar61;
  ImFont **ppIVar62;
  long lVar63;
  ImFontBuildDstData *pIVar64;
  stbrp_rect_conflict *psVar65;
  stbtt_packedchar *psVar66;
  int *piVar67;
  stbrp_context_conflict *ptr;
  uchar *puVar68;
  void *ptr_00;
  stbtt__edge *p;
  stbtt__buf *scanline;
  undefined8 *puVar69;
  stbtt__active_edge *psVar70;
  stbtt_uint32 *psVar71;
  ushort uVar72;
  ushort uVar73;
  uint uVar74;
  ulong uVar75;
  stbtt__active_edge *psVar76;
  stbtt__buf *psVar77;
  ImWchar *src_range;
  ImWchar *pIVar78;
  float fVar79;
  ImU32 *it;
  ushort *puVar80;
  uint *puVar81;
  stbtt__active_edge *psVar82;
  uchar *puVar83;
  byte *pbVar84;
  ImVector<ImFontConfig> *pIVar85;
  int output_i;
  int iVar86;
  uint uVar87;
  stbtt__edge *psVar88;
  long lVar89;
  ulong uVar90;
  ulong uVar91;
  uchar *puVar92;
  ulong uVar93;
  byte *pbVar94;
  wchar_t wVar95;
  int iVar96;
  int iVar97;
  long lVar98;
  stbtt__edge *psVar99;
  ImBitVector *this;
  ImFontAtlas_conflict *pIVar100;
  ImU32 bit_n;
  uint uVar101;
  ulong uVar102;
  long lVar103;
  wchar_t wVar104;
  uchar *puVar105;
  bool bVar106;
  bool bVar107;
  char cVar112;
  float sum;
  float fVar108;
  float fVar109;
  char cVar113;
  undefined4 uVar114;
  undefined4 uVar116;
  undefined1 extraout_var [12];
  ushort uVar115;
  undefined4 uVar117;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 in_XMM3 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  float fVar131;
  stbtt__buf sVar132;
  float y0_2;
  wchar_t local_498;
  int y1;
  ulong local_490;
  stbtt_uint32 charstrings;
  ImVector<ImFontConfig> *local_480;
  ImFontAtlas_conflict *local_478;
  float local_46c;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  uint local_448;
  stbrp_node_conflict *local_430;
  stbtt__point *local_420;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_414;
  float local_40c;
  ulong local_408;
  float *local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  float local_3ec;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  undefined8 *local_3c0;
  ImVector<stbtt_packedchar> buf_packedchars;
  int local_388;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context_conflict *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  stbtt__edge *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  ImFontConfig_conflict *local_300;
  ulong local_2f8;
  uchar *local_2f0;
  stbrp_rect_conflict *local_2e8;
  long local_2e0;
  long local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  stbtt_packedchar *local_2c0;
  ulong local_2b8;
  int local_2b0;
  int x1_1;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  stbtt__buf b;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x929,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  local_480 = (ImVector<ImFontConfig> *)&atlas->ConfigData;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  iVar56 = 0;
  local_478 = (ImFontAtlas_conflict *)atlas;
  while (pIVar100 = local_478, pIVar85 = local_480, iVar16 = *(int *)local_480, local_3f8 = iVar56,
        iVar56 < iVar16) {
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar56);
    pIVar61 = ImVector<ImFontConfig>::operator[](pIVar85,iVar56);
    if ((pIVar61->DstFont == (ImFont *)0x0) ||
       (pIVar18 = pIVar61->DstFont->ContainerAtlas,
       pIVar18 != pIVar100 && pIVar18 != (ImFontAtlas_conflict *)0x0)) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x941,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar60->DstIndex = -1;
    iVar86 = 0;
    iVar56 = -1;
    while ((iVar86 < (atlas->Fonts).Size && (iVar56 == -1))) {
      pIVar19 = pIVar61->DstFont;
      ppIVar62 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)&atlas->Fonts,iVar86);
      if (pIVar19 == *ppIVar62) {
        pIVar60->DstIndex = iVar86;
        iVar56 = iVar86;
      }
      else {
        iVar56 = pIVar60->DstIndex;
      }
      iVar86 = iVar86 + 1;
    }
    if (iVar56 == -1) {
      __assert_fail("src_tmp.DstIndex != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x94a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    data = (stbtt_uint8 *)pIVar61->FontData;
    wVar104 = pIVar61->FontNo;
    sVar10 = *data;
    if (sVar10 == '\0') {
      if (data[1] != '\x01') goto LAB_001ed2dc;
LAB_001ecdbd:
      if ((data[2] != '\0') || (data[3] != '\0')) goto LAB_001ed2dc;
LAB_001ecdd5:
      sVar55 = -(uint)(wVar104 != L'\0');
    }
    else {
      if (sVar10 != 't') {
        if (sVar10 != 'O') {
          if ((sVar10 != '1') || (data[1] != '\0')) goto LAB_001ed2dc;
          goto LAB_001ecdbd;
        }
        if (((data[1] != 'T') || (data[2] != 'T')) || (data[3] != 'O')) goto LAB_001ed2dc;
        goto LAB_001ecdd5;
      }
      sVar10 = data[1];
      if (sVar10 == 'r') {
        if ((data[2] != 'u') || (data[3] != 'e')) goto LAB_001ed2dc;
        goto LAB_001ecdd5;
      }
      if (sVar10 != 't') {
        if (((sVar10 != 'y') || (data[2] != 'p')) || (data[3] != '1')) goto LAB_001ed2dc;
        goto LAB_001ecdd5;
      }
      if (((data[2] != 'c') || (data[3] != 'f')) ||
         (((sVar55 = ttULONG(data + 4), sVar55 != 0x20000 && (sVar55 != 0x10000)) ||
          (uVar87 = *(uint *)(data + 8),
          (int)(uVar87 >> 0x18 | (uVar87 & 0xff0000) >> 8 | (uVar87 & 0xff00) << 8 | uVar87 << 0x18)
          <= wVar104)))) goto LAB_001ed2dc;
      sVar55 = ttULONG(data + (long)wVar104 * 4 + 0xc);
    }
    if ((int)sVar55 < 0) {
LAB_001ed2dc:
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x94f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    (pIVar60->FontInfo).data = data;
    (pIVar60->FontInfo).fontstart = sVar55;
    (pIVar60->FontInfo).cff.data = (uchar *)0x0;
    (pIVar60->FontInfo).cff.cursor = 0;
    (pIVar60->FontInfo).cff.size = 0;
    sVar49 = stbtt__find_table(data,sVar55,"cmap");
    sVar50 = stbtt__find_table(data,sVar55,"loca");
    local_490 = CONCAT44(local_490._4_4_,sVar50);
    (pIVar60->FontInfo).loca = sVar50;
    sVar50 = stbtt__find_table(data,sVar55,"head");
    (pIVar60->FontInfo).head = sVar50;
    sVar51 = stbtt__find_table(data,sVar55,"glyf");
    (pIVar60->FontInfo).glyf = sVar51;
    sVar52 = stbtt__find_table(data,sVar55,"hhea");
    (pIVar60->FontInfo).hhea = sVar52;
    sVar53 = stbtt__find_table(data,sVar55,"hmtx");
    (pIVar60->FontInfo).hmtx = sVar53;
    sVar54 = stbtt__find_table(data,sVar55,"kern");
    (pIVar60->FontInfo).kern = sVar54;
    sVar54 = stbtt__find_table(data,sVar55,"GPOS");
    (pIVar60->FontInfo).gpos = sVar54;
    if ((((sVar49 == 0) || (sVar50 == 0)) || (sVar52 == 0)) || (sVar53 == 0)) goto LAB_001ef54e;
    if (sVar51 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar50 = stbtt__find_table(data,sVar55,"CFF ");
      if (sVar50 == 0) goto LAB_001ef54e;
      (pIVar60->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar60->FontInfo).fdselect.cursor = 0;
      (pIVar60->FontInfo).fdselect.size = 0;
      (pIVar60->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar60->FontInfo).fontdicts.cursor = 0;
      (pIVar60->FontInfo).fontdicts.size = 0;
      (pIVar60->FontInfo).cff.data = data + sVar50;
      (pIVar60->FontInfo).cff.cursor = 0;
      (pIVar60->FontInfo).cff.size = 0x20000000;
      puVar68 = (pIVar60->FontInfo).cff.data;
      uVar36 = (pIVar60->FontInfo).cff.cursor;
      uVar37 = (pIVar60->FontInfo).cff.size;
      b.data._0_4_ = (int)puVar68;
      b.data._4_4_ = (undefined4)((ulong)puVar68 >> 0x20);
      b.cursor = uVar36;
      b.size = uVar37;
      stbtt__buf_skip(&b,2);
      lVar63 = (long)b.cursor;
      uVar87 = 0;
      if (b.cursor < b.size) {
        b.cursor = b.cursor + 1;
        uVar87 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar63);
      }
      stbtt__buf_seek(&b,uVar87);
      stbtt__cff_get_index(&b);
      sVar132 = stbtt__cff_get_index(&b);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar132,0);
      stbtt__cff_get_index(&b);
      sVar132 = stbtt__cff_get_index(&b);
      (pIVar60->FontInfo).gsubrs = sVar132;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      sVar132.data._4_4_ = b.data._4_4_;
      sVar132.data._0_4_ = (int)b.data;
      sVar132.cursor = b.cursor;
      sVar132.size = b.size;
      sVar132 = stbtt__get_subrs(sVar132,(stbtt__buf)buf_rects);
      iVar56 = y1;
      (pIVar60->FontInfo).subrs = sVar132;
      if ((buf_packedchars.Size != 2) || (sVar50 = charstrings, charstrings == 0))
      goto LAB_001ef54e;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_001ef54e;
        stbtt__buf_seek(&b,fdarrayoff);
        sVar132 = stbtt__cff_get_index(&b);
        (pIVar60->FontInfo).fontdicts = sVar132;
        sVar132 = stbtt__buf_range(&b,iVar56,b.size - iVar56);
        (pIVar60->FontInfo).fdselect = sVar132;
      }
      stbtt__buf_seek(&b,sVar50);
      sVar132 = stbtt__cff_get_index(&b);
      (pIVar60->FontInfo).charstrings = sVar132;
    }
    else if ((float)local_490 == 0.0) goto LAB_001ef54e;
    sVar55 = stbtt__find_table(data,sVar55,"maxp");
    if (sVar55 == 0) {
      uVar87 = 0xffff;
    }
    else {
      uVar87 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar55 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar55 + 4) >> 8);
    }
    (pIVar60->FontInfo).numGlyphs = uVar87;
    uVar72 = *(ushort *)(data + (ulong)sVar49 + 2);
    (pIVar60->FontInfo).index_map = 0;
    uVar102 = (ulong)(ushort)(uVar72 << 8 | uVar72 >> 8);
    uVar87 = sVar49 + 4;
    iVar56 = 0;
    while (bVar106 = uVar102 != 0, uVar102 = uVar102 - 1, bVar106) {
      uVar72 = *(ushort *)(data + uVar87) << 8 | *(ushort *)(data + uVar87) >> 8;
      if ((uVar72 == 0) ||
         ((uVar72 == 3 &&
          ((uVar72 = *(ushort *)(data + (ulong)uVar87 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar87 + 2) >> 8, uVar72 == 10 || (uVar72 == 1))))))
      {
        sVar55 = ttULONG(data + (ulong)uVar87 + 4);
        iVar56 = sVar55 + sVar49;
        (pIVar60->FontInfo).index_map = iVar56;
      }
      uVar87 = uVar87 + 8;
    }
    if (iVar56 == 0) goto LAB_001ef54e;
    (pIVar60->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar60->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar60->FontInfo).head + 0x32) >> 8);
    pIVar64 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar60->DstIndex);
    pIVar78 = pIVar61->GlyphRanges;
    if (pIVar78 == (ImWchar *)0x0) {
      pIVar78 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar60->SrcRanges = pIVar78;
    uVar87 = pIVar60->GlyphsHighest;
    for (; (*pIVar78 != 0 && (uVar72 = pIVar78[1], uVar72 != 0)); pIVar78 = pIVar78 + 2) {
      if ((int)uVar87 <= (int)(uint)uVar72) {
        uVar87 = (uint)uVar72;
      }
      pIVar60->GlyphsHighest = uVar87;
    }
    pIVar64->SrcCount = pIVar64->SrcCount + 1;
    if ((int)uVar87 < pIVar64->GlyphsHighest) {
      uVar87 = pIVar64->GlyphsHighest;
    }
    pIVar64->GlyphsHighest = uVar87;
    iVar56 = local_3f8 + 1;
  }
  iVar56 = 0;
  for (iVar86 = 0; iVar86 < src_tmp_array.Size; iVar86 = iVar86 + 1) {
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar86);
    pIVar64 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar60->DstIndex);
    ImBitVector::Create(&pIVar60->GlyphsSet,pIVar60->GlyphsHighest + 1);
    this = &pIVar64->GlyphsSet;
    if ((pIVar64->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this,pIVar64->GlyphsHighest + 1);
    }
    for (puVar80 = pIVar60->SrcRanges;
        (uVar87 = (uint)*puVar80, *puVar80 != 0 && (uVar72 = puVar80[1], uVar72 != 0));
        puVar80 = puVar80 + 2) {
      for (; uVar87 <= uVar72; uVar87 = uVar87 + 1) {
        _Var48 = ImBitVector::TestBit(this,uVar87);
        if ((!_Var48) && (iVar57 = stbtt_FindGlyphIndex(&pIVar60->FontInfo,uVar87), iVar57 != 0)) {
          pIVar60->GlyphsCount = pIVar60->GlyphsCount + 1;
          pIVar64->GlyphsCount = pIVar64->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar60->GlyphsSet,uVar87);
          ImBitVector::SetBit(this,uVar87);
          iVar56 = iVar56 + 1;
        }
        uVar72 = puVar80[1];
      }
    }
  }
  iVar86 = 0;
  while (pIVar100 = local_478, iVar86 < src_tmp_array.Size) {
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar86);
    ImVector<int>::reserve(&pIVar60->GlyphsList,pIVar60->GlyphsCount);
    puVar81 = (pIVar60->GlyphsSet).Storage.Data;
    puVar1 = puVar81 + (pIVar60->GlyphsSet).Storage.Size;
    iVar57 = 0;
    for (; puVar81 < puVar1; puVar81 = puVar81 + 1) {
      uVar87 = *puVar81;
      if (uVar87 != 0) {
        for (uVar101 = 0; uVar101 != 0x20; uVar101 = uVar101 + 1) {
          if ((uVar87 >> (uVar101 & 0x1f) & 1) != 0) {
            b.data._0_4_ = uVar101 + iVar57;
            ImVector<int>::push_back(&pIVar60->GlyphsList,(int *)&b);
          }
        }
      }
      iVar57 = iVar57 + 0x20;
    }
    ImVector<unsigned_int>::clear(&(pIVar60->GlyphsSet).Storage);
    iVar86 = iVar86 + 1;
    if ((pIVar60->GlyphsList).Size != pIVar60->GlyphsCount) {
      __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0x97e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
  }
  for (iVar86 = 0; iVar86 < dst_tmp_array.Size; iVar86 = iVar86 + 1) {
    pIVar64 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,iVar86);
    ImVector<unsigned_int>::clear(&(pIVar64->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects = (ImVector<stbrp_rect>)ZEXT816(0);
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,iVar56);
  pIVar85 = local_480;
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,iVar56);
  uVar102 = 0;
  memset(buf_rects.Data,0,(long)buf_rects.Size << 4);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar86 = 0;
  iVar56 = 0;
  iVar57 = 0;
  while( true ) {
    iVar58 = (int)uVar102;
    if (src_tmp_array.Size <= iVar58) break;
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar58);
    if (pIVar60->GlyphsCount != 0) {
      psVar65 = ImVector<stbrp_rect>::operator[](&buf_rects,iVar56);
      pIVar60->Rects = psVar65;
      psVar66 = ImVector<stbtt_packedchar>::operator[](&buf_packedchars,iVar86);
      pIVar60->PackedChars = psVar66;
      iVar97 = pIVar60->GlyphsCount;
      pIVar61 = ImVector<ImFontConfig>::operator[](pIVar85,iVar58);
      fVar108 = pIVar61->SizePixels;
      (pIVar60->PackRange).font_size = fVar108;
      (pIVar60->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar60->PackRange).array_of_unicode_codepoints = (pIVar60->GlyphsList).Data;
      iVar58 = (pIVar60->GlyphsList).Size;
      (pIVar60->PackRange).num_chars = iVar58;
      (pIVar60->PackRange).chardata_for_range = pIVar60->PackedChars;
      (pIVar60->PackRange).h_oversample = (uchar)pIVar61->OversampleH;
      (pIVar60->PackRange).v_oversample = (uchar)pIVar61->OversampleV;
      local_490 = uVar102;
      if (fVar108 <= 0.0) {
        uVar72 = *(ushort *)((pIVar60->FontInfo).data + (long)(pIVar60->FontInfo).head + 0x12);
        fVar108 = -fVar108 / (float)(ushort)(uVar72 << 8 | uVar72 >> 8);
      }
      else {
        fVar108 = stbtt_ScaleForPixelHeight(&pIVar60->FontInfo,fVar108);
      }
      iVar56 = iVar56 + iVar97;
      iVar86 = iVar86 + iVar97;
      wVar104 = pIVar100->TexGlyphPadding;
      lVar63 = 6;
      for (lVar103 = 0; pIVar85 = local_480, pIVar100 = local_478, uVar102 = local_490,
          lVar103 < iVar58; lVar103 = lVar103 + 1) {
        piVar67 = ImVector<int>::operator[](&pIVar60->GlyphsList,(int)lVar103);
        iVar58 = stbtt_FindGlyphIndex(&pIVar60->FontInfo,*piVar67);
        if (iVar58 == 0) {
          __assert_fail("glyph_index_in_font != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                        ,0x9ad,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar60->FontInfo,iVar58,(float)pIVar61->OversampleH * fVar108,
                   (float)pIVar61->OversampleV * fVar108,fVar108,in_XMM3._0_4_,(int *)&b,
                   (int *)&charstrings,(int *)&fdarrayoff,&y1);
        uVar87 = (pIVar61->OversampleH + ((fdarrayoff + wVar104) - (int)b.data)) - 1;
        psVar65 = pIVar60->Rects;
        *(short *)((long)psVar65 + lVar63 + -2) = (short)uVar87;
        uVar101 = (pIVar61->OversampleV + ((y1 + wVar104) - charstrings)) - 1;
        *(short *)((long)&psVar65->id + lVar63) = (short)uVar101;
        iVar57 = iVar57 + (uVar101 & 0xffff) * (uVar87 & 0xffff);
        iVar58 = (pIVar60->GlyphsList).Size;
        lVar63 = lVar63 + 0x10;
      }
    }
    uVar102 = (ulong)((int)uVar102 + 1);
  }
  pIVar100->TexHeight = L'\0';
  local_498 = pIVar100->TexDesiredWidth;
  if (local_498 < L'\x01') {
    iVar56 = (int)SQRT((float)iVar57);
    local_498 = L'က';
    if ((iVar56 < 0xb33) && (local_498 = L'ࠀ', iVar56 < 0x599)) {
      local_498 = (uint)(0x2cb < iVar56) * 0x200 + L'Ȁ';
    }
  }
  pIVar100->TexWidth = local_498;
  wVar104 = pIVar100->TexGlyphPadding;
  ptr = (stbrp_context_conflict *)ImGui::MemAlloc(0x48);
  iVar56 = local_498 - wVar104;
  local_430 = (stbrp_node_conflict *)ImGui::MemAlloc((long)iVar56 << 4);
  if ((ptr == (stbrp_context_conflict *)0x0) || (local_430 == (stbrp_node_conflict *)0x0)) {
    if (ptr != (stbrp_context_conflict *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_430 != (stbrp_node_conflict *)0x0) {
      ImGui::MemFree(local_430);
    }
    local_430 = (stbrp_node_conflict *)0x0;
    wVar104 = L'\0';
    local_498 = L'\0';
    ptr = (stbrp_context_conflict *)0x0;
  }
  else {
    if ((wVar104 < L'\xffff8001') || (0xffff < iVar56)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar87 = iVar56 - 1;
    uVar93 = 0;
    psVar24 = local_430;
    uVar102 = uVar93;
    if (0 < (int)uVar87) {
      uVar93 = (ulong)uVar87;
      uVar102 = uVar93;
    }
    while( true ) {
      bVar106 = uVar93 == 0;
      uVar93 = uVar93 - 1;
      if (bVar106) break;
      psVar24->next = psVar24 + 1;
      psVar24 = psVar24 + 1;
    }
    local_430[uVar102].next = (stbrp_node_conflict *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_430;
    ptr->active_head = ptr->extra;
    ptr->width = iVar56;
    ptr->height = 0x8000 - wVar104;
    ptr->num_nodes = iVar56;
    ptr->align = (int)(uVar87 + iVar56) / iVar56;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord_conflict)iVar56;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node_conflict *)0x0;
  }
  local_350 = ptr;
  ImFontAtlasBuildPackCustomRects((ImFontAtlas *)pIVar100,ptr);
  for (iVar56 = 0; pIVar85 = local_480, iVar56 < src_tmp_array.Size; iVar56 = iVar56 + 1) {
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar56);
    if (pIVar60->GlyphsCount != 0) {
      stbrp_pack_rects(local_350,pIVar60->Rects,pIVar60->GlyphsCount);
      psVar65 = pIVar60->Rects;
      uVar102 = (ulong)(uint)pIVar60->GlyphsCount;
      if (pIVar60->GlyphsCount < 1) {
        uVar102 = 0;
      }
      for (lVar63 = 0; uVar102 * 0x10 != lVar63; lVar63 = lVar63 + 0x10) {
        if (*(int *)((long)&psVar65->was_packed + lVar63) != 0) {
          wVar95 = (uint)*(ushort *)((long)&psVar65->h + lVar63) +
                   (uint)*(ushort *)((long)&psVar65->y + lVar63);
          if (wVar95 < pIVar100->TexHeight) {
            wVar95 = pIVar100->TexHeight;
          }
          pIVar100->TexHeight = wVar95;
        }
      }
    }
  }
  wVar95 = pIVar100->TexHeight;
  if ((pIVar100->Flags & 1) == 0) {
    uVar87 = wVar95 + L'\xffffffff' >> 1 | wVar95 + L'\xffffffff';
    uVar87 = (int)uVar87 >> 2 | uVar87;
    uVar87 = (int)uVar87 >> 4 | uVar87;
    uVar87 = (int)uVar87 >> 8 | uVar87;
    wVar95 = (int)uVar87 >> 0x10 | uVar87;
  }
  wVar95 = wVar95 + L'\x01';
  pIVar100->TexHeight = wVar95;
  auVar119._0_4_ = (float)pIVar100->TexWidth;
  auVar119._4_4_ = (float)wVar95;
  auVar119._8_8_ = 0;
  auVar119 = divps(_DAT_0021c530,auVar119);
  pIVar100->TexUvScale = auVar119._0_8_;
  puVar68 = (uchar *)ImGui::MemAlloc((long)(wVar95 * pIVar100->TexWidth));
  pIVar100->TexPixelsAlpha8 = puVar68;
  memset(puVar68,0,(long)pIVar100->TexHeight * (long)pIVar100->TexWidth);
  uVar102 = 0;
  puVar68 = pIVar100->TexPixelsAlpha8;
  lVar63 = (long)local_498;
  local_278 = pshuflw(ZEXT416((uint)wVar104),ZEXT416((uint)wVar104),0);
  local_2f0 = puVar68 + 1;
  while( true ) {
    iVar56 = (int)uVar102;
    if (src_tmp_array.Size <= iVar56) break;
    local_300 = ImVector<ImFontConfig>::operator[](pIVar85,iVar56);
    local_2f8 = uVar102;
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar56);
    if (pIVar60->GlyphsCount != 0) {
      psVar65 = pIVar60->Rects;
      bVar106 = true;
      lVar103 = 0;
      local_2e8 = psVar65;
      while( true ) {
        uVar117 = 0x80000000;
        uVar116 = 0x80000000;
        uVar114 = 0x80000000;
        if (!bVar106) break;
        fVar108 = (pIVar60->PackRange).font_size;
        if (fVar108 <= 0.0) {
          uVar72 = *(ushort *)((pIVar60->FontInfo).data + (long)(pIVar60->FontInfo).head + 0x12);
          local_248 = -fVar108 / (float)(ushort)(uVar72 << 8 | uVar72 >> 8);
        }
        else {
          local_248 = stbtt_ScaleForPixelHeight(&pIVar60->FontInfo,fVar108);
          uVar114 = extraout_var._0_4_;
          uVar116 = extraout_var._4_4_;
          uVar117 = extraout_var._8_4_;
        }
        uVar102._0_1_ = (pIVar60->PackRange).h_oversample;
        uVar21 = (pIVar60->PackRange).v_oversample;
        uVar22 = *(undefined6 *)&(pIVar60->PackRange).field_0x22;
        uVar102._1_7_ = CONCAT61(uVar22,uVar21);
        auVar27._8_6_ = 0;
        auVar27._0_8_ = uVar102;
        auVar27[0xe] = (char)((uint6)uVar22 >> 0x28);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar102;
        auVar29[0xc] = (char)((uint6)uVar22 >> 0x20);
        auVar29._13_2_ = auVar27._13_2_;
        auVar30._8_4_ = 0;
        auVar30._0_8_ = uVar102;
        auVar30._12_3_ = auVar29._12_3_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar102;
        auVar31[10] = (char)((uint6)uVar22 >> 0x18);
        auVar31._11_4_ = auVar30._11_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar102;
        auVar32._10_5_ = auVar31._10_5_;
        auVar33[8] = (char)((uint6)uVar22 >> 0x10);
        auVar33._0_8_ = uVar102;
        auVar33._9_6_ = auVar32._9_6_;
        auVar38._7_8_ = 0;
        auVar38._0_7_ = auVar33._8_7_;
        cVar113 = (char)((uint6)uVar22 >> 8);
        Var39 = CONCAT81(SUB158(auVar38 << 0x40,7),cVar113);
        auVar44._9_6_ = 0;
        auVar44._0_9_ = Var39;
        cVar112 = (char)uVar22;
        auVar34[4] = cVar112;
        auVar34._0_4_ = (uint)uVar102;
        auVar34._5_10_ = SUB1510(auVar44 << 0x30,5);
        auVar40._11_4_ = 0;
        auVar40._0_11_ = auVar34._4_11_;
        auVar41._1_12_ = SUB1512(auVar40 << 0x20,3);
        auVar41[0] = uVar21;
        uVar72 = CONCAT11(0,(undefined1)uVar102);
        auVar35._2_13_ = auVar41;
        auVar35._0_2_ = uVar72;
        uVar73 = auVar41._0_2_;
        sVar25 = -auVar34._4_2_;
        uVar115 = (ushort)Var39;
        sVar26 = -uVar115;
        auVar28._10_2_ = 0;
        auVar28._0_10_ = auVar35._0_10_;
        auVar28._12_2_ = uVar115;
        uVar46 = CONCAT42(auVar28._10_4_,auVar34._4_2_);
        auVar42._6_8_ = 0;
        auVar42._0_6_ = uVar46;
        auVar110._0_4_ = (float)uVar72;
        auVar110._4_4_ = (float)(int)CONCAT82(SUB148(auVar42 << 0x40,6),uVar73);
        auVar110._8_4_ = (float)(int)uVar46;
        auVar110._12_4_ = (float)uVar115;
        local_268 = divps(_DAT_0021c530,auVar110);
        auVar128[0] = -((undefined1)uVar102 == 0);
        auVar128[1] = -((undefined1)uVar102 == 0);
        auVar128[2] = -((undefined1)uVar102 == 0);
        auVar128[3] = -((undefined1)uVar102 == 0);
        auVar128[4] = -(uVar21 == '\0');
        auVar128[5] = -(uVar21 == '\0');
        auVar128[6] = -(uVar21 == '\0');
        auVar128[7] = -(uVar21 == '\0');
        auVar128[8] = -(cVar112 == '\0');
        auVar128[9] = -(cVar112 == '\0');
        auVar128[10] = -(cVar112 == '\0');
        auVar128[0xb] = -(cVar112 == '\0');
        auVar128[0xc] = -(cVar113 == '\0');
        auVar128[0xd] = -(cVar113 == '\0');
        auVar128[0xe] = -(cVar113 == '\0');
        auVar128[0xf] = -(cVar113 == '\0');
        Var45 = CONCAT64(CONCAT42(CONCAT22(sVar26,sVar26),sVar25),CONCAT22(sVar25,sVar26));
        auVar43._4_8_ = (long)((unkuint10)Var45 >> 0x10);
        auVar43._2_2_ = 1 - uVar73;
        auVar43._0_2_ = 1 - uVar73;
        auVar120._0_4_ = (float)(int)(short)(1 - uVar72);
        auVar120._4_4_ = (float)(auVar43._0_4_ >> 0x10);
        auVar120._8_4_ = (float)((int)((unkuint10)Var45 >> 0x10) >> 0x10);
        auVar120._12_4_ = (float)(int)sVar26;
        local_298._0_4_ = local_248 * auVar110._0_4_;
        local_298._4_4_ = local_248 * auVar110._4_4_;
        local_298._8_4_ = local_248 * auVar110._8_4_;
        local_298._12_4_ = local_248 * auVar110._12_4_;
        auVar111._0_4_ = auVar110._0_4_ + auVar110._0_4_;
        auVar111._4_4_ = auVar110._4_4_ + auVar110._4_4_;
        auVar111._8_4_ = auVar110._8_4_ + auVar110._8_4_;
        auVar111._12_4_ = auVar110._12_4_ + auVar110._12_4_;
        local_258 = divps(auVar120,auVar111);
        local_258 = ~auVar128 & local_258;
        lVar103 = (long)(int)lVar103;
        fVar108 = local_298._4_4_;
        if ((float)local_298._0_4_ <= local_298._4_4_) {
          fVar108 = (float)local_298._0_4_;
        }
        local_3ec = (0.35 / fVar108) * (0.35 / fVar108);
        local_320 = uVar102 & 0xff;
        local_328 = (ulong)((uint)uVar102._1_7_ & 0xff);
        uVar87 = (uint)uVar102 & 0xff;
        uVar102 = CONCAT44(local_298._4_4_,local_298._0_4_);
        auVar125._0_8_ = uVar102 ^ 0x8000000000000000;
        auVar125._8_4_ = local_298._0_4_;
        auVar125._12_4_ = -local_298._4_4_;
        lVar89 = 0;
        local_2a8 = local_298._4_4_;
        fStack_2a4 = local_298._4_4_;
        fStack_2a0 = local_298._4_4_;
        fStack_29c = local_298._4_4_;
        local_288 = auVar125;
        uStack_244 = uVar114;
        uStack_240 = uVar116;
        uStack_23c = uVar117;
LAB_001edc39:
        fVar108 = auVar125._0_4_;
        if (lVar89 < (pIVar60->PackRange).num_chars) {
          if (((psVar65[lVar103].was_packed != 0) && (psVar65[lVar103].w != 0)) &&
             (psVar65[lVar103].h != 0)) {
            piVar67 = (pIVar60->PackRange).array_of_unicode_codepoints;
            if (piVar67 == (int *)0x0) {
              iVar56 = (pIVar60->PackRange).first_unicode_codepoint_in_range + (int)lVar89;
            }
            else {
              iVar56 = piVar67[lVar89];
            }
            local_2c0 = (pIVar60->PackRange).chardata_for_range + lVar89;
            local_340 = lVar89;
            local_338 = lVar103;
            iVar86 = stbtt_FindGlyphIndex(&pIVar60->FontInfo,iVar56);
            psVar47 = psVar65 + lVar103;
            uVar2 = psVar47->w;
            uVar6 = psVar47->h;
            uVar7 = psVar47->x;
            uVar9 = psVar47->y;
            psVar47 = psVar65 + lVar103;
            psVar47->w = uVar2 - local_278._0_2_;
            psVar47->h = uVar6 - local_278._2_2_;
            psVar47->x = uVar7 + local_278._4_2_;
            psVar47->y = uVar9 + local_278._6_2_;
            puVar83 = (pIVar60->FontInfo).data;
            uVar72 = *(ushort *)(puVar83 + (long)(pIVar60->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar83 + (long)(pIVar60->FontInfo).hhea + 0x22) >> 8;
            iVar56 = (pIVar60->FontInfo).hmtx;
            lVar89 = (ulong)uVar72 * 4 + (long)iVar56 + -4;
            lVar98 = (ulong)uVar72 * 4 + (long)iVar56 + -3;
            if (iVar86 < (int)(uint)uVar72) {
              lVar89 = (long)(iVar86 * 4) + (long)iVar56;
              lVar98 = (long)(iVar86 * 4) + 1 + (long)iVar56;
            }
            bVar11 = puVar83[lVar89];
            bVar12 = puVar83[lVar98];
            auVar119 = local_278;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar60->FontInfo,iVar86,(float)local_298._0_4_,local_2a8,local_278._0_4_,
                       fVar108,&x0_1,&y0_1,&x1_1,&local_2b0);
            fVar130 = auVar119._0_4_;
            uVar72 = psVar65[lVar103].x;
            uVar115 = psVar65[lVar103].y;
            local_408 = (ulong)psVar65[lVar103].w;
            uVar15 = psVar65[lVar103].h;
            uVar101 = stbtt_GetGlyphShape(&pIVar60->FontInfo,iVar86,(stbtt_vertex **)&fdarrayoff);
            fVar79 = (float)(((int)local_408 - uVar87) + 1);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar60->FontInfo,iVar86,(float)local_298._0_4_,local_2a8,fVar130,fVar108,
                       &y1,&iy0,(int *)0x0,(int *)0x0);
            iVar56 = y1;
            local_46c = fVar79;
            if (fVar79 != 0.0) {
              uVar59 = ((uint)uVar15 - (uint)uVar73) + 1;
              if (uVar59 != 0) {
                local_408 = (ulong)((int)local_408 - uVar87);
                lVar89 = CONCAT44(uStack_414,fdarrayoff);
                local_348 = (ulong)(uint)iy0;
                uVar93 = 0;
                uVar102 = (ulong)uVar101;
                if ((int)uVar101 < 1) {
                  uVar102 = uVar93;
                }
                uVar75 = 0;
                for (; uVar102 * 0xe - uVar93 != 0; uVar93 = uVar93 + 0xe) {
                  uVar75 = (ulong)((int)uVar75 + (uint)(*(char *)(lVar89 + 0xc + uVar93) == '\x01'))
                  ;
                }
                if (((int)uVar75 != 0) &&
                   (ptr_00 = ImGui::MemAlloc(uVar75 * 4), ptr_00 != (void *)0x0)) {
                  local_420 = (stbtt__point *)0x0;
                  iVar86 = 0;
                  iVar58 = 0;
                  iVar57 = 0;
                  do {
                    if (iVar58 == 1) {
                      local_420 = (stbtt__point *)ImGui::MemAlloc((long)iVar57 << 3);
                      if (local_420 == (stbtt__point *)0x0) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(ptr_00);
                        break;
                      }
                    }
                    else if (iVar58 == 2) goto LAB_001ee0ea;
                    b.data._0_4_ = 0;
                    fVar108 = 0.0;
                    fVar79 = 0.0;
                    uVar101 = 0xffffffff;
                    for (lVar98 = 0; uVar102 * 0xe - lVar98 != 0; lVar98 = lVar98 + 0xe) {
                      iVar57 = (int)b.data;
                      switch(*(undefined1 *)(lVar89 + 0xc + lVar98)) {
                      case 1:
                        if (-1 < (int)uVar101) {
                          *(int *)((long)ptr_00 + (ulong)uVar101 * 4) = (int)b.data - iVar86;
                        }
                        uVar101 = uVar101 + 1;
                        auVar119 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar98)),
                                           ZEXT416(*(uint *)(lVar89 + lVar98)),0x60);
                        fVar108 = (float)(auVar119._0_4_ >> 0x10);
                        fVar79 = (float)(auVar119._4_4_ >> 0x10);
                        iVar86 = (int)b.data;
                        iVar57 = (int)b.data + 1;
                        if (local_420 != (stbtt__point *)0x0) {
                          local_420[(int)b.data].x = fVar108;
                          local_420[(int)b.data].y = fVar79;
                        }
                        break;
                      case 2:
                        auVar119 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar98)),
                                           ZEXT416(*(uint *)(lVar89 + lVar98)),0x60);
                        fVar108 = (float)(auVar119._0_4_ >> 0x10);
                        fVar79 = (float)(auVar119._4_4_ >> 0x10);
                        iVar57 = (int)b.data + 1;
                        if (local_420 != (stbtt__point *)0x0) {
                          local_420[(int)b.data].x = fVar108;
                          local_420[(int)b.data].y = fVar79;
                        }
                        break;
                      case 3:
                        stbtt__tesselate_curve
                                  (local_420,(int *)&b,fVar108,fVar79,
                                   (float)(int)*(short *)(lVar89 + 4 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 6 + lVar98),
                                   (float)(int)*(short *)(lVar89 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 2 + lVar98),local_3ec,0);
                        goto LAB_001ee06c;
                      case 4:
                        stbtt__tesselate_cubic
                                  (local_420,(int *)&b,fVar108,fVar79,
                                   (float)(int)*(short *)(lVar89 + 4 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 6 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 8 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 10 + lVar98),
                                   (float)(int)*(short *)(lVar89 + lVar98),
                                   (float)(int)*(short *)(lVar89 + 2 + lVar98),local_3ec,0);
LAB_001ee06c:
                        auVar119 = pshuflw(ZEXT416(*(uint *)(lVar89 + lVar98)),
                                           ZEXT416(*(uint *)(lVar89 + lVar98)),0x60);
                        fVar108 = (float)(auVar119._0_4_ >> 0x10);
                        fVar79 = (float)(auVar119._4_4_ >> 0x10);
                        iVar57 = (int)b.data;
                      }
                      b.data._0_4_ = iVar57;
                    }
                    *(int *)((long)ptr_00 + (long)(int)uVar101 * 4) = (int)b.data - iVar86;
                    iVar58 = iVar58 + 1;
                    iVar57 = (int)b.data;
                  } while( true );
                }
              }
            }
            goto LAB_001eec75;
          }
          goto LAB_001ef1ff;
        }
        bVar106 = false;
      }
      fVar108 = local_300->RasterizerMultiply;
      if ((fVar108 != 1.0) || (NAN(fVar108))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar108);
        piVar67 = &pIVar60->Rects->was_packed;
        for (iVar56 = 0; pIVar85 = local_480, iVar56 < pIVar60->GlyphsCount; iVar56 = iVar56 + 1) {
          if (*piVar67 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,pIVar100->TexPixelsAlpha8,(uint)*(ushort *)(piVar67 + -1),
                       (uint)*(stbrp_coord_conflict *)((long)piVar67 + -2),
                       (uint)*(ushort *)(piVar67 + -2),
                       (uint)*(stbrp_coord_conflict *)((long)piVar67 + -6),pIVar100->TexWidth);
          }
          piVar67 = piVar67 + 4;
        }
      }
      pIVar60->Rects = (stbrp_rect_conflict *)0x0;
    }
    uVar102 = (ulong)((int)local_2f8 + 1);
  }
  ImGui::MemFree(local_430);
  ImGui::MemFree(local_350);
  ImVector<stbrp_rect>::clear(&buf_rects);
  for (iVar56 = 0; iVar56 < src_tmp_array.Size; iVar56 = iVar56 + 1) {
    pIVar60 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar56);
    if (pIVar60->GlyphsCount != 0) {
      pIVar61 = ImVector<ImFontConfig>::operator[](local_480,iVar56);
      pIVar19 = pIVar61->DstFont;
      fVar108 = stbtt_ScaleForPixelHeight(&pIVar60->FontInfo,pIVar61->SizePixels);
      puVar68 = (pIVar60->FontInfo).data;
      lVar63 = (long)(pIVar60->FontInfo).hhea;
      uVar72 = *(ushort *)(puVar68 + lVar63 + 4);
      uVar72 = uVar72 << 8 | uVar72 >> 8;
      fVar79 = -1.0;
      if (0 < (short)uVar72) {
        fVar79 = 1.0;
      }
      uVar73 = *(ushort *)(puVar68 + lVar63 + 6);
      uVar73 = uVar73 << 8 | uVar73 >> 8;
      fVar130 = -1.0;
      if (0 < (short)uVar73) {
        fVar130 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                ((ImFontAtlas *)local_478,pIVar19,(ImFontConfig *)pIVar61,
                 (float)(int)((float)(int)(short)uVar72 * fVar108 + fVar79),
                 (float)(int)((float)(int)(short)uVar73 * fVar108 + fVar130));
      fVar108 = (pIVar61->GlyphOffset).x;
      fVar79 = (float)(int)(pIVar19->Ascent + 0.5) + (pIVar61->GlyphOffset).y;
      lVar63 = 0;
      for (lVar103 = 0; lVar103 < pIVar60->GlyphsCount; lVar103 = lVar103 + 1) {
        pIVar78 = (ImWchar *)ImVector<int>::operator[](&pIVar60->GlyphsList,(int)lVar103);
        psVar66 = pIVar60->PackedChars;
        fVar109 = 1.0 / (float)local_478->TexHeight;
        fVar130 = 1.0 / (float)local_478->TexWidth;
        ImFont::AddGlyph(pIVar19,pIVar61,*pIVar78,
                         *(float *)((long)&psVar66->xoff + lVar63) + 0.0 + fVar108,
                         *(float *)((long)&psVar66->yoff + lVar63) + 0.0 + fVar79,
                         *(float *)((long)&psVar66->xoff2 + lVar63) + 0.0 + fVar108,
                         *(float *)((long)&psVar66->yoff2 + lVar63) + 0.0 + fVar79,
                         (float)*(ushort *)((long)&psVar66->x0 + lVar63) * fVar130,
                         (float)*(ushort *)((long)&psVar66->y0 + lVar63) * fVar109,
                         (float)*(ushort *)((long)&psVar66->x1 + lVar63) * fVar130,
                         (float)*(ushort *)((long)&psVar66->y1 + lVar63) * fVar109,
                         *(float *)((long)&psVar66->xadvance + lVar63));
        lVar63 = lVar63 + 0x1c;
      }
    }
    pIVar100 = local_478;
  }
  ImVector<ImFontBuildSrcData>::clear_destruct(&src_tmp_array);
  ImFontAtlasBuildFinish((ImFontAtlas *)pIVar100);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_001ef54e:
  bVar106 = iVar16 <= local_3f8;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar106;
LAB_001ee0ea:
  if (local_420 != (stbtt__point *)0x0) {
    iVar86 = 0;
    for (uVar102 = 0; uVar75 != uVar102; uVar102 = uVar102 + 1) {
      iVar86 = iVar86 + *(int *)((long)ptr_00 + uVar102 * 4);
    }
    p = (stbtt__edge *)ImGui::MemAlloc((long)(iVar86 + 1) * 0x14);
    if (p != (stbtt__edge *)0x0) {
      iVar86 = 0;
      iVar57 = 0;
      for (uVar102 = 0; uVar102 != uVar75; uVar102 = uVar102 + 1) {
        iVar58 = *(int *)((long)ptr_00 + uVar102 * 4);
        uVar91 = (ulong)(iVar58 - 1);
        iVar97 = iVar58;
        for (uVar93 = 0; iVar96 = (int)uVar91, (long)uVar93 < (long)iVar97; uVar93 = uVar93 + 1) {
          fVar108 = local_420[(long)iVar86 + (long)iVar96].y;
          fVar79 = local_420[(long)iVar86 + uVar93].y;
          if ((fVar108 != fVar79) || (NAN(fVar108) || NAN(fVar79))) {
            iVar97 = (int)uVar93;
            if (fVar108 <= fVar79) {
              iVar97 = iVar96;
              iVar96 = (int)uVar93;
            }
            p[iVar57].invert = (uint)(fVar79 < fVar108);
            sVar4 = local_420[(long)iVar86 + (long)iVar96];
            sVar5 = local_420[(long)iVar86 + (long)iVar97];
            psVar99 = p + iVar57;
            psVar99->x0 = sVar4.x * local_288._0_4_ + 0.0;
            psVar99->y0 = sVar4.y * local_288._4_4_ + 0.0;
            psVar99->x1 = sVar5.x * local_288._8_4_ + 0.0;
            psVar99->y1 = sVar5.y * local_288._12_4_ + 0.0;
            iVar57 = iVar57 + 1;
            iVar97 = *(int *)((long)ptr_00 + uVar102 * 4);
          }
          uVar91 = uVar93 & 0xffffffff;
        }
        iVar86 = iVar58 + iVar86;
      }
      stbtt__sort_edges_quicksort(p,iVar57);
      psVar99 = p;
      for (uVar102 = 1; (long)uVar102 < (long)iVar57; uVar102 = uVar102 + 1) {
        uVar3 = p[uVar102].x0;
        uVar8 = p[uVar102].y0;
        b.cursor = p[uVar102].invert;
        uVar17 = p[uVar102].x1;
        uVar23 = p[uVar102].y1;
        psVar88 = psVar99;
        for (uVar93 = uVar102; 0 < (long)uVar93; uVar93 = uVar93 - 1) {
          if (psVar88->y0 <= (float)uVar8) goto LAB_001ee2a1;
          psVar88[1].invert = psVar88->invert;
          fVar108 = psVar88->y0;
          fVar79 = psVar88->x1;
          fVar130 = psVar88->y1;
          psVar88[1].x0 = psVar88->x0;
          psVar88[1].y0 = fVar108;
          psVar88[1].x1 = fVar79;
          psVar88[1].y1 = fVar130;
          psVar88 = psVar88 + -1;
        }
        uVar93 = 0;
LAB_001ee2a1:
        iVar86 = (int)uVar93;
        if (uVar102 != (uVar93 & 0xffffffff)) {
          p[iVar86].x0 = (float)uVar3;
          p[iVar86].y0 = (float)uVar8;
          p[iVar86].x1 = (float)uVar17;
          p[iVar86].y1 = (float)uVar23;
          p[iVar86].invert = b.cursor;
        }
        psVar99 = psVar99 + 1;
        b.data._0_4_ = uVar17;
        b.data._4_4_ = uVar23;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline = &b;
      if (0x3f < (int)local_408) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)local_46c * 8 + 4);
      }
      local_2d8 = (long)(int)local_46c;
      local_400 = (float *)((long)&scanline->data + local_2d8 * 4);
      p[iVar57].y0 = (float)(int)((int)local_348 + uVar59) + 1.0;
      local_2c8 = local_2d8 * 4;
      local_2d0 = (long)(int)local_408 * 4 + 8;
      local_40c = (float)(int)local_46c;
      uVar102 = 0;
      if ((int)local_46c < 1) {
        local_46c = 0.0;
      }
      local_2e0 = 0;
      if (0 < local_2d8) {
        local_2e0 = local_2d8;
      }
      uVar93 = (ulong)uVar59;
      if ((int)uVar59 < 1) {
        uVar93 = uVar102;
      }
      psVar82 = (stbtt__active_edge *)0x0;
      local_3f0 = 0;
      local_3c0 = (undefined8 *)0x0;
      uVar75 = local_348 & 0xffffffff;
      iVar86 = 0;
      local_330 = p;
      while (local_388 = (int)uVar93, iVar86 != local_388) {
        fVar108 = (float)(int)uVar75;
        fVar79 = fVar108 + 1.0;
        local_3f4 = iVar86;
        memset(scanline,0,local_2c8);
        memset(local_400,0,local_2d0);
        psVar70 = (stbtt__active_edge *)&charstrings;
        while (psVar76 = psVar70, psVar20 = psVar76->next, psVar20 != (stbtt__active_edge *)0x0) {
          psVar70 = psVar20;
          if (psVar20->ey <= fVar108) {
            psVar76->next = psVar20->next;
            if ((psVar20->direction == 0.0) && (!NAN(psVar20->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                            ,0xc63,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar20->direction = 0.0;
            psVar20->next = psVar82;
            psVar70 = psVar76;
            psVar82 = psVar20;
          }
        }
        local_2b8 = uVar102;
        bVar106 = (int)local_348 != 0;
        bVar107 = local_3f4 == 0;
        for (psVar99 = local_330; fVar130 = psVar99->y0, fVar130 <= fVar79; psVar99 = psVar99 + 1) {
          fVar109 = psVar99->y1;
          if ((fVar130 != fVar109) || (psVar70 = psVar82, NAN(fVar130) || NAN(fVar109))) {
            if (psVar82 == (stbtt__active_edge *)0x0) {
              if (local_3f0 == 0) {
                puVar69 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar69 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                ,0xad1,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar69 = local_3c0;
                fVar130 = psVar99->y0;
                fVar109 = psVar99->y1;
                local_3f0 = 799;
              }
              else {
                local_3f0 = local_3f0 + -1;
                puVar69 = local_3c0;
              }
              psVar82 = (stbtt__active_edge *)(puVar69 + (long)local_3f0 * 4 + 1);
              psVar70 = (stbtt__active_edge *)0x0;
              local_3c0 = puVar69;
            }
            else {
              psVar70 = psVar82->next;
            }
            fVar124 = psVar99->x0;
            fVar122 = (psVar99->x1 - fVar124) / (fVar109 - fVar130);
            psVar82->fdx = fVar122;
            psVar82->fdy = (float)(-(uint)(fVar122 != 0.0) & (uint)(1.0 / fVar122));
            psVar82->fx = ((fVar108 - fVar130) * fVar122 + fVar124) - (float)iVar56;
            psVar82->direction = *(float *)(&DAT_00257c38 + (ulong)(psVar99->invert == 0) * 4);
            psVar82->sy = fVar130;
            psVar82->ey = fVar109;
            psVar82->next = (stbtt__active_edge *)0x0;
            if (fVar109 < fVar108 && (bVar107 && bVar106)) {
              psVar82->ey = fVar108;
              fVar109 = fVar108;
            }
            if (fVar109 < fVar108) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                            ,0xc76,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar82->next = _charstrings;
            _charstrings = psVar82;
          }
          psVar82 = psVar70;
        }
        local_330 = psVar99;
        psVar70 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar70 != (stbtt__active_edge *)0x0; psVar70 = psVar70->next) {
            fVar130 = psVar70->ey;
            if (fVar130 < fVar108) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                            ,0xba5,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar109 = psVar70->fx;
            auVar129._0_8_ = CONCAT44(0,fVar109);
            auVar129._8_8_ = 0;
            fVar124 = psVar70->fdx;
            if ((fVar124 != 0.0) || (NAN(fVar124))) {
              fVar122 = psVar70->sy;
              if (fVar79 < fVar122) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                              ,3000,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar131 = fVar124 + fVar109;
              fVar127 = (float)(~-(uint)(fVar108 < fVar122) & (uint)fVar109 |
                               (uint)((fVar122 - fVar108) * fVar124 + fVar109) &
                               -(uint)(fVar108 < fVar122));
              if ((((fVar127 < 0.0) ||
                   (fVar123 = (float)(~-(uint)(fVar130 < fVar79) & (uint)fVar131 |
                                     (uint)((fVar130 - fVar108) * fVar124 + fVar109) &
                                     -(uint)(fVar130 < fVar79)), fVar123 < 0.0)) ||
                  (local_40c <= fVar127)) || (local_40c <= fVar123)) {
                local_318 = auVar129;
                fVar130 = 0.0;
                while (local_46c != fVar130) {
                  fVar122 = (float)(int)fVar130;
                  fVar126 = (float)(int)((int)fVar130 + 1U);
                  fVar109 = local_318._0_4_;
                  fVar127 = (fVar122 - fVar109) / fVar124 + fVar108;
                  fVar123 = (fVar126 - fVar109) / fVar124 + fVar108;
                  if ((fVar122 <= fVar109) || (fVar131 <= fVar126)) {
                    if ((fVar122 <= fVar131) || (fVar109 <= fVar126)) {
                      fVar118 = fVar108;
                      if (((fVar122 <= fVar109) || (fVar131 <= fVar122)) &&
                         ((fVar122 <= fVar131 || (fVar109 <= fVar122)))) {
                        fVar127 = fVar108;
                        if (((fVar109 < fVar126) && (fVar126 < fVar131)) ||
                           ((fVar122 = fVar109, fVar131 < fVar126 && (fVar126 < fVar109)))) {
                          local_490 = CONCAT44(local_490._4_4_,fVar123);
                          goto LAB_001ee869;
                        }
                        goto LAB_001ee91d;
                      }
                    }
                    else {
                      local_490 = CONCAT44(local_490._4_4_,fVar123);
                      stbtt__handle_clipped_edge
                                ((float *)scanline,(int)fVar130,psVar70,fVar109,fVar108,fVar126,
                                 fVar123);
                      fVar109 = fVar126;
                      fVar118 = (float)local_490;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar130,psVar70,fVar109,fVar118,fVar122,
                               fVar127);
                  }
                  else {
                    local_490 = CONCAT44(local_490._4_4_,fVar123);
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar130,psVar70,fVar109,fVar108,fVar122,
                               fVar127);
                    fVar109 = fVar122;
                    fVar123 = (float)local_490;
LAB_001ee869:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar130,psVar70,fVar109,fVar127,fVar126,
                               fVar123);
                    fVar122 = fVar126;
                    fVar127 = (float)local_490;
                  }
LAB_001ee91d:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar130,psVar70,fVar122,fVar127,fVar131,fVar79);
                  fVar130 = (float)((int)fVar130 + 1U);
                }
              }
              else {
                if (fVar122 <= fVar108) {
                  fVar122 = fVar108;
                }
                uVar101 = (uint)fVar127;
                if (fVar79 <= fVar130) {
                  fVar130 = fVar79;
                }
                uVar59 = (uint)fVar123;
                if (uVar101 == uVar59) {
                  if (((int)uVar101 < 0) || ((int)local_408 < (int)uVar101)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                  ,0xbd4,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar102 = (ulong)uVar101;
                  *(float *)((long)&scanline->data + uVar102 * 4) =
                       (((fVar123 - (float)(int)uVar101) + (fVar127 - (float)(int)uVar101)) * -0.5 +
                       1.0) * psVar70->direction * (fVar130 - fVar122) +
                       *(float *)((long)&scanline->data + uVar102 * 4);
                  fVar109 = (fVar130 - fVar122) * psVar70->direction;
                }
                else {
                  fVar124 = psVar70->fdy;
                  uVar74 = uVar101;
                  fVar126 = fVar127;
                  if (fVar123 < fVar127) {
                    fVar126 = fVar108 - fVar122;
                    fVar122 = (fVar108 - fVar130) + fVar79;
                    fVar124 = -fVar124;
                    fVar109 = fVar131;
                    uVar74 = uVar59;
                    uVar59 = uVar101;
                    fVar130 = fVar126 + fVar79;
                    fVar126 = fVar123;
                    fVar123 = fVar127;
                  }
                  iVar86 = uVar74 + 1;
                  fVar131 = ((float)iVar86 - fVar109) * fVar124 + fVar108;
                  fVar109 = psVar70->direction;
                  fVar127 = (fVar131 - fVar122) * fVar109;
                  *(float *)((long)&scanline->data + (long)(int)uVar74 * 4) =
                       (1.0 - ((fVar126 - (float)(int)uVar74) + 1.0) * 0.5) * fVar127 +
                       *(float *)((long)&scanline->data + (long)(int)uVar74 * 4);
                  uVar102 = (ulong)(int)uVar59;
                  for (lVar89 = (long)iVar86; lVar89 < (long)uVar102; lVar89 = lVar89 + 1) {
                    *(float *)((long)&scanline->data + lVar89 * 4) =
                         fVar124 * fVar109 * 0.5 + fVar127 +
                         *(float *)((long)&scanline->data + lVar89 * 4);
                    fVar127 = fVar127 + fVar124 * fVar109;
                  }
                  if (1.01 < ABS(fVar127)) {
                    __assert_fail("fabsf(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                  ,0xbfb,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  *(float *)((long)&scanline->data + uVar102 * 4) =
                       (fVar130 - (fVar124 * (float)(int)(uVar59 - iVar86) + fVar131)) *
                       (((fVar123 - (float)(int)uVar59) + 0.0) * -0.5 + 1.0) * fVar109 + fVar127 +
                       *(float *)((long)&scanline->data + uVar102 * 4);
                  fVar109 = (fVar130 - fVar122) * fVar109;
                }
                local_400[uVar102 + 1] = fVar109 + local_400[uVar102 + 1];
              }
            }
            else if (fVar109 < local_40c) {
              if (0.0 <= fVar109) {
                local_318 = auVar129;
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar109,psVar70,fVar109,fVar108,fVar109,fVar79);
                iVar86 = (int)fVar109 + 1;
                auVar121 = local_318;
              }
              else {
                iVar86 = 0;
                auVar121._8_8_ = 0;
                auVar121._0_8_ = auVar129._0_8_;
              }
              stbtt__handle_clipped_edge
                        (local_400,iVar86,psVar70,auVar121._0_4_,fVar108,auVar121._0_4_,fVar79);
            }
          }
        }
        fVar108 = 0.0;
        uVar102 = local_2b8 & 0xffffffff;
        lVar89 = local_2e0;
        psVar77 = scanline;
        while (bVar106 = lVar89 != 0, lVar89 = lVar89 + -1, bVar106) {
          fVar108 = fVar108 + *(float *)((long)&psVar77->data + local_2d8 * 4);
          iVar86 = (int)(ABS(*(float *)&psVar77->data + fVar108) * 255.0 + 0.5);
          if (0xfe < iVar86) {
            iVar86 = 0xff;
          }
          puVar68[(long)(int)uVar102 + (ulong)uVar115 * lVar63 + (ulong)uVar72] = (uchar)iVar86;
          uVar102 = (ulong)((int)uVar102 + 1);
          psVar77 = (stbtt__buf *)((long)&psVar77->data + 4);
        }
        psVar71 = &charstrings;
        while (psVar71 = *(stbtt_uint32 **)psVar71, psVar71 != (stbtt_uint32 *)0x0) {
          psVar71[2] = (stbtt_uint32)((float)psVar71[3] + (float)psVar71[2]);
        }
        uVar75 = (ulong)((int)uVar75 + 1);
        uVar102 = (ulong)(uint)((int)local_2b8 + local_498);
        iVar86 = local_3f4 + 1;
      }
      while (local_3c0 != (undefined8 *)0x0) {
        puVar69 = (undefined8 *)*local_3c0;
        ImGui::MemFree(local_3c0);
        local_3c0 = puVar69;
      }
      if (scanline != &b) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(p);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(local_420);
  }
LAB_001eec75:
  ImGui::MemFree((void *)CONCAT44(uStack_414,fdarrayoff));
  uVar101._0_2_ = psVar65[lVar103].x;
  uVar101._2_2_ = psVar65[lVar103].y;
  uVar59._0_2_ = psVar65[lVar103].w;
  uVar59._2_2_ = psVar65[lVar103].h;
  if (1 < (byte)local_320) {
    lVar89 = (long)((uVar101 >> 0x10) * local_498);
    puVar83 = puVar68 + lVar89 + (ulong)(ushort)(undefined2)uVar101;
    iVar56 = (uVar59 & 0xffff) - uVar87;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    if (iVar56 < 0) {
      iVar56 = -1;
    }
    uVar102 = (long)iVar56 + 1;
    puVar105 = local_2f0 + lVar89 + (ulong)(ushort)(undefined2)uVar101 + (long)iVar56;
    for (uVar101 = 0; uVar93 = local_320, uVar101 != uVar59 >> 0x10; uVar101 = uVar101 + 1) {
      memset(&b,0,local_320);
      puVar92 = puVar105;
      uVar75 = uVar102;
      switch((int)uVar93) {
      case 2:
        uVar93 = 0;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = puVar83[uVar91];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 2 & 7)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          puVar83[uVar91] = (uchar)(uVar74 >> 1);
        }
        break;
      case 3:
        uVar93 = 0;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = puVar83[uVar91];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 3 & 7)) = bVar13;
          uVar93 = (ulong)((int)uVar93 + ((uint)bVar13 - (uint)bVar14));
          puVar83[uVar91] = (uchar)(uVar93 / 3);
        }
        break;
      case 4:
        uVar93 = 0;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = puVar83[uVar91];
          uVar90 = (ulong)((uint)uVar91 & 7);
          bVar14 = *(byte *)((long)&b.data + uVar90);
          *(byte *)((long)&b.data + (uVar90 ^ 4)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          puVar83[uVar91] = (uchar)(uVar74 >> 2);
        }
        break;
      case 5:
        uVar93 = 0;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = puVar83[uVar91];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 5 & 7)) = bVar13;
          uVar93 = (ulong)((int)uVar93 + ((uint)bVar13 - (uint)bVar14));
          puVar83[uVar91] = (uchar)(uVar93 / 5);
        }
        break;
      default:
        uVar93 = 0;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = puVar83[uVar91];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar87 + (uint)uVar91 & 7)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          puVar83[uVar91] = (uchar)(uVar74 / uVar87);
        }
      }
      for (; uVar75 < (uVar59 & 0xffff); uVar75 = uVar75 + 1) {
        if (*puVar92 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                        ,0xf41,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar74 = (int)uVar93 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
        uVar93 = (ulong)uVar74;
        *puVar92 = (uchar)(uVar74 / uVar87);
        puVar92 = puVar92 + 1;
      }
      puVar83 = puVar83 + lVar63;
      puVar105 = puVar105 + lVar63;
    }
    uVar101._0_2_ = psVar65[lVar103].x;
    uVar101._2_2_ = psVar65[lVar103].y;
    uVar59._0_2_ = psVar65[lVar103].w;
    uVar59._2_2_ = psVar65[lVar103].h;
  }
  if (1 < (byte)local_328) {
    lVar89 = (long)((uVar101 >> 0x10) * local_498);
    pbVar84 = puVar68 + lVar89 + (ulong)(ushort)uVar101;
    uVar72 = (ushort)(uVar59 >> 0x10);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    local_448 = (uint)uVar73;
    iVar56 = uVar72 - local_448;
    if (iVar56 < 0) {
      iVar56 = -1;
    }
    uVar102 = (long)iVar56 + 1;
    puVar83 = puVar68 + lVar63 * uVar102 + lVar89 + (ulong)(ushort)uVar101;
    for (uVar101 = 0; uVar93 = local_328, uVar101 != (uVar59 & 0xffff); uVar101 = uVar101 + 1) {
      memset(&b,0,local_328);
      puVar105 = puVar83;
      uVar75 = uVar102;
      switch((int)uVar93) {
      case 2:
        uVar93 = 0;
        pbVar94 = pbVar84;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = *pbVar94;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 2 & 7)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          *pbVar94 = (byte)(uVar74 >> 1);
          pbVar94 = pbVar94 + lVar63;
        }
        break;
      case 3:
        uVar93 = 0;
        pbVar94 = pbVar84;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = *pbVar94;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 3 & 7)) = bVar13;
          uVar93 = (ulong)((int)uVar93 + ((uint)bVar13 - (uint)bVar14));
          *pbVar94 = (byte)(uVar93 / 3);
          pbVar94 = pbVar94 + lVar63;
        }
        break;
      case 4:
        uVar93 = 0;
        pbVar94 = pbVar84;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = *pbVar94;
          uVar90 = (ulong)((uint)uVar91 & 7);
          bVar14 = *(byte *)((long)&b.data + uVar90);
          *(byte *)((long)&b.data + (uVar90 ^ 4)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          *pbVar94 = (byte)(uVar74 >> 2);
          pbVar94 = pbVar94 + lVar63;
        }
        break;
      case 5:
        uVar93 = 0;
        pbVar94 = pbVar84;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = *pbVar94;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 5 & 7)) = bVar13;
          uVar93 = (ulong)((int)uVar93 + ((uint)bVar13 - (uint)bVar14));
          *pbVar94 = (byte)(uVar93 / 5);
          pbVar94 = pbVar94 + lVar63;
        }
        break;
      default:
        uVar93 = 0;
        pbVar94 = pbVar84;
        for (uVar91 = 0; uVar102 != uVar91; uVar91 = uVar91 + 1) {
          bVar13 = *pbVar94;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar73 + (uint)uVar91 & 7)) = bVar13;
          uVar74 = (int)uVar93 + ((uint)bVar13 - (uint)bVar14);
          uVar93 = (ulong)uVar74;
          *pbVar94 = (byte)(uVar74 / uVar73);
          pbVar94 = pbVar94 + lVar63;
        }
      }
      for (; uVar75 < uVar72; uVar75 = uVar75 + 1) {
        if (*puVar105 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                        ,0xf7f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar74 = (int)uVar93 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar75 & 7));
        uVar93 = (ulong)uVar74;
        *puVar105 = (uchar)(uVar74 / local_448);
        puVar105 = puVar105 + lVar63;
      }
      pbVar84 = pbVar84 + 1;
      puVar83 = puVar83 + 1;
    }
    uVar101._0_2_ = psVar65[lVar103].x;
    uVar101._2_2_ = psVar65[lVar103].y;
    uVar59._0_2_ = psVar65[lVar103].w;
    uVar59._2_2_ = psVar65[lVar103].h;
  }
  local_2c0->x0 = (short)uVar101;
  local_2c0->y0 = (short)(uVar101 >> 0x10);
  uVar72 = (ushort)(uVar59 >> 0x10);
  local_2c0->x1 = (short)uVar101 + (short)uVar59;
  local_2c0->y1 = (short)(uVar101 >> 0x10) + uVar72;
  local_2c0->xadvance = (float)(int)(short)((ushort)bVar11 * 0x100 + (ushort)bVar12) * local_248;
  local_2c0->xoff = (float)x0_1 * local_268._0_4_ + local_258._0_4_;
  local_2c0->yoff = (float)y0_1 * local_268._4_4_ + local_258._4_4_;
  local_2c0->xoff2 = (float)(int)((uVar59 & 0xffff) + x0_1) * local_268._0_4_ + local_258._0_4_;
  local_2c0->yoff2 = (float)(int)((uint)uVar72 + y0_1) * local_268._4_4_ + local_258._4_4_;
  lVar89 = local_340;
  lVar103 = local_338;
  pIVar85 = local_480;
  psVar65 = local_2e8;
  pIVar100 = local_478;
  auVar125 = local_258;
LAB_001ef1ff:
  lVar103 = lVar103 + 1;
  lVar89 = lVar89 + 1;
  goto LAB_001edc39;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}